

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

void fiobj_str_clear(FIOBJ str)

{
  size_t sVar1;
  fio_str_info_s local_28;
  ulong local_10;
  FIOBJ str_local;
  
  local_10 = str;
  sVar1 = fiobj_type_is(str,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    fio_str_resize(&local_28,(fio_str_s_conflict *)((local_10 & 0xfffffffffffffff8) + 0x10),0);
    *(undefined8 *)((local_10 & 0xfffffffffffffff8) + 8) = 0;
    return;
  }
  __assert_fail("FIOBJ_TYPE_IS(str, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0xec,"void fiobj_str_clear(FIOBJ)");
}

Assistant:

void fiobj_str_clear(FIOBJ str) {
  assert(FIOBJ_TYPE_IS(str, FIOBJ_T_STRING));
  fio_str_resize(&obj2str(str)->str, 0);
  obj2str(str)->hash = 0;
}